

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<ConjRule_*>::push(vec<ConjRule_*> *this,ConjRule **elem)

{
  ConjRule **ppCVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = this->sz;
  if (uVar2 == this->cap) {
    uVar3 = 2;
    if (1 < uVar2) {
      uVar3 = (ulong)(uVar2 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar3;
    ppCVar1 = (ConjRule **)realloc(this->data,uVar3 << 3);
    this->data = ppCVar1;
    uVar2 = this->sz;
  }
  else {
    ppCVar1 = this->data;
  }
  this->sz = uVar2 + 1;
  ppCVar1[uVar2] = *elem;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}